

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token_iterator.h
# Opt level: O0

void __thiscall string_token_iterator::find_next(string_token_iterator *this)

{
  size_type sVar1;
  string_token_iterator *this_local;
  
  sVar1 = std::__cxx11::string::find_first_not_of((char *)this->str,(ulong)this->separator);
  this->start = sVar1;
  if (this->start == 0xffffffffffffffff) {
    this->end = 0;
    this->start = 0;
    this->str = (string *)0x0;
  }
  else {
    sVar1 = std::__cxx11::string::find_first_of((char *)this->str,(ulong)this->separator);
    this->end = sVar1;
  }
  return;
}

Assistant:

void find_next(void)
  {
    start = str->find_first_not_of(separator, end);
    if(start == std::string::npos)
    {
      start = end = 0;
      str = 0;
      return;
    }

    end = str->find_first_of(separator, start);
  }